

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_graph_shape.h
# Opt level: O3

Edge * __thiscall
s2builderutil::GraphShape::edge(Edge *__return_storage_ptr__,GraphShape *this,int e)

{
  int iVar1;
  int iVar2;
  pointer ppVar3;
  pointer pVVar4;
  VType VVar5;
  
  ppVar3 = (this->g_->edges_->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = ppVar3[e].first;
  iVar2 = ppVar3[e].second;
  pVVar4 = (this->g_->vertices_->
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (__return_storage_ptr__->v0).c_[2] = pVVar4[iVar1].c_[2];
  VVar5 = pVVar4[iVar1].c_[1];
  (__return_storage_ptr__->v0).c_[0] = pVVar4[iVar1].c_[0];
  (__return_storage_ptr__->v0).c_[1] = VVar5;
  VVar5 = pVVar4[iVar2].c_[1];
  (__return_storage_ptr__->v1).c_[0] = pVVar4[iVar2].c_[0];
  (__return_storage_ptr__->v1).c_[1] = VVar5;
  (__return_storage_ptr__->v1).c_[2] = pVVar4[iVar2].c_[2];
  return __return_storage_ptr__;
}

Assistant:

Edge edge(int e) const override {
    Graph::Edge g_edge = g_.edge(e);
    return Edge(g_.vertex(g_edge.first), g_.vertex(g_edge.second));
  }